

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallmon.cpp
# Opt level: O2

void __thiscall wallmon::wallmon(wallmon *this)

{
  _Rb_tree_header *p_Var1;
  pointer ppVar2;
  pointer ppVar3;
  initializer_list<prmon::parameter> __l;
  allocator_type local_1bb;
  allocator local_1ba;
  allocator local_1b9;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,prmon::monitored_value>,std::_Select1st<std::pair<std::__cxx11::string_const,prmon::monitored_value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
  *local_1b8;
  parameter_list *local_1b0;
  wallmon *local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180;
  string local_160;
  string local_140;
  monitored_value local_120;
  parameter local_90;
  
  (this->super_MessageBase).logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->super_MessageBase).logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Imonitor)._vptr_Imonitor = (_func_int **)&PTR__wallmon_001db968;
  std::__cxx11::string::string((string *)&local_140,"wtime",(allocator *)&local_1a0);
  std::__cxx11::string::string((string *)&local_160,"s",&local_1b9);
  std::__cxx11::string::string((string *)&local_180,"",&local_1ba);
  prmon::parameter::parameter(&local_120.m_param,&local_140,&local_160,&local_180);
  __l._M_len = 1;
  __l._M_array = &local_120.m_param;
  std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>::vector
            (&this->params,__l,&local_1bb);
  prmon::parameter::~parameter(&local_120.m_param);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  (this->walltime_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->walltime_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1b8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,prmon::monitored_value>,std::_Select1st<std::pair<std::__cxx11::string_const,prmon::monitored_value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
               *)&this->walltime_stats;
  p_Var1 = &(this->walltime_stats)._M_t._M_impl.super__Rb_tree_header;
  (this->walltime_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->walltime_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->walltime_stats)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->got_mother_starttime = false;
  local_1b0 = &this->params;
  local_1a8 = this;
  std::__cxx11::string::string((string *)&local_120,"wallmon",(allocator *)&local_1a0);
  MessageBase::log_init(&this->super_MessageBase,(string *)&local_120,&global_logging_level);
  std::__cxx11::string::~string((string *)&local_120);
  ppVar2 = (this->params).super__Vector_base<prmon::parameter,_std::allocator<prmon::parameter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (ppVar3 = (this->params).
                super__Vector_base<prmon::parameter,_std::allocator<prmon::parameter>_>._M_impl.
                super__Vector_impl_data._M_start; ppVar3 != ppVar2; ppVar3 = ppVar3 + 1) {
    std::__cxx11::string::string((string *)&local_1a0,(string *)ppVar3);
    prmon::parameter::parameter(&local_90,ppVar3);
    prmon::monitored_value::monitored_value(&local_120,&local_90,true,0);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,prmon::monitored_value>,std::_Select1st<std::pair<std::__cxx11::string_const,prmon::monitored_value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
    ::_M_emplace_unique<std::__cxx11::string_const,prmon::monitored_value>
              (local_1b8,&local_1a0,&local_120);
    prmon::parameter::~parameter(&local_120.m_param);
    prmon::parameter::~parameter(&local_90);
    std::__cxx11::string::~string((string *)&local_1a0);
  }
  return;
}

Assistant:

wallmon::wallmon() : got_mother_starttime{false} {
  log_init(MONITOR_NAME);
#undef MONITOR_NAME
  for (const auto& param : params) {
    walltime_stats.emplace(param.get_name(),
                           prmon::monitored_value(param, true));
  }
}